

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_write_round_one
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t *olen_local;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ecjpake_context *ctx_local;
  
  iVar1 = ecjpake_kkpp_write(ctx->md_type,&ctx->grp,ctx->point_format,&(ctx->grp).G,&ctx->xm1,
                             &ctx->Xm1,&ctx->xm2,&ctx->Xm2,ecjpake_id[ctx->role],buf,len,olen,f_rng,
                             p_rng);
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_write_round_one(mbedtls_ecjpake_context *ctx,
                                    unsigned char *buf, size_t len, size_t *olen,
                                    int (*f_rng)(void *, unsigned char *, size_t),
                                    void *p_rng)
{
    return ecjpake_kkpp_write(ctx->md_type, &ctx->grp, ctx->point_format,
                              &ctx->grp.G,
                              &ctx->xm1, &ctx->Xm1, &ctx->xm2, &ctx->Xm2,
                              ID_MINE, buf, len, olen, f_rng, p_rng);
}